

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

btVector3 __thiscall btMultiBody::getAngularMomentum(btMultiBody *this)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  btQuaternion *pbVar3;
  btMultibodyLink *pbVar4;
  long in_RDI;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar10 [12];
  undefined8 uVar11;
  undefined4 uVar5;
  undefined4 uVar6;
  btQuaternion bVar7;
  btVector3 bVar8;
  int i;
  btAlignedObjectArray<btQuaternion> rot_from_world;
  btAlignedObjectArray<btVector3> vel;
  btAlignedObjectArray<btVector3> omega;
  int num_links;
  btVector3 result;
  undefined1 in_stack_fffffffffffffd58 [16];
  btAlignedObjectArray<btVector3> *this_00;
  undefined1 in_stack_fffffffffffffd68 [16];
  undefined1 in_stack_fffffffffffffd78 [16];
  undefined1 auVar9 [12];
  undefined1 in_stack_fffffffffffffd88 [16];
  btQuaternion *in_stack_fffffffffffffdd8;
  btQuaternion *in_stack_fffffffffffffde0;
  btScalar local_208;
  btScalar bStack_204;
  btVector3 *in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe28 [16];
  btScalar local_1c8;
  btScalar bStack_1c4;
  btScalar local_1a8;
  btScalar bStack_1a4;
  btScalar local_178;
  btScalar bStack_174;
  btVector3 local_104;
  btScalar local_f4;
  btScalar bStack_f0;
  undefined8 uStack_ec;
  int local_e4;
  btScalar local_e0;
  btScalar bStack_dc;
  undefined8 local_d8;
  btScalar local_d0;
  btScalar bStack_cc;
  undefined8 local_c8;
  btAlignedObjectArray<btQuaternion> local_b0;
  btVector3 local_90;
  btAlignedObjectArray<btVector3> local_80;
  btVector3 local_50;
  btAlignedObjectArray<btVector3> local_40;
  int local_1c;
  btVector3 local_10;
  
  auVar9 = in_stack_fffffffffffffd78._4_12_;
  local_1c = getNumLinks((btMultiBody *)0x239fb4);
  this_00 = in_stack_fffffffffffffd58._8_8_;
  btAlignedObjectArray<btVector3>::btAlignedObjectArray(this_00);
  btVector3::btVector3(&local_50);
  btAlignedObjectArray<btVector3>::resize(auVar9._4_8_,auVar9._0_4_,in_stack_fffffffffffffd68._8_8_)
  ;
  btAlignedObjectArray<btVector3>::btAlignedObjectArray(this_00);
  btVector3::btVector3(&local_90);
  btAlignedObjectArray<btVector3>::resize(auVar9._4_8_,auVar9._0_4_,in_stack_fffffffffffffd68._8_8_)
  ;
  btAlignedObjectArray<btQuaternion>::btAlignedObjectArray
            ((btAlignedObjectArray<btQuaternion> *)this_00);
  btQuaternion::btQuaternion((btQuaternion *)0x23a07d);
  btAlignedObjectArray<btQuaternion>::resize
            (auVar9._4_8_,auVar9._0_4_,in_stack_fffffffffffffd68._8_8_);
  btAlignedObjectArray<btVector3>::operator[](&local_40,0);
  btAlignedObjectArray<btVector3>::operator[](&local_80,0);
  compTreeLinkVelocities
            (in_stack_fffffffffffffe28._8_8_,in_stack_fffffffffffffe28._0_8_,
             in_stack_fffffffffffffe20);
  pbVar3 = btAlignedObjectArray<btQuaternion>::operator[](&local_b0,0);
  uVar2 = *(undefined8 *)(in_RDI + 0x30);
  *(undefined8 *)(pbVar3->super_btQuadWord).m_floats = *(undefined8 *)(in_RDI + 0x28);
  *(undefined8 *)((pbVar3->super_btQuadWord).m_floats + 2) = uVar2;
  btAlignedObjectArray<btQuaternion>::operator[](&local_b0,0);
  bVar7 = btQuaternion::inverse((btQuaternion *)this_00);
  local_c8 = bVar7.super_btQuadWord.m_floats._8_8_;
  local_178 = bVar7.super_btQuadWord.m_floats[0];
  bStack_174 = bVar7.super_btQuadWord.m_floats[1];
  local_d0 = local_178;
  bStack_cc = bStack_174;
  btAlignedObjectArray<btVector3>::operator[](&local_40,0);
  bVar8 = ::operator*(in_stack_fffffffffffffd68._8_8_,in_stack_fffffffffffffd68._0_8_);
  local_d8 = bVar8.m_floats._8_8_;
  local_1a8 = bVar8.m_floats[0];
  bStack_1a4 = bVar8.m_floats[1];
  local_e0 = local_1a8;
  bStack_dc = bStack_1a4;
  bVar8 = quatRotate(in_stack_fffffffffffffd88._8_8_,in_stack_fffffffffffffd88._0_8_);
  local_10.m_floats._8_8_ = bVar8.m_floats._8_8_;
  local_1c8 = bVar8.m_floats[0];
  bStack_1c4 = bVar8.m_floats[1];
  local_10.m_floats[0] = local_1c8;
  local_10.m_floats[1] = bStack_1c4;
  for (local_e4 = 0; local_e4 < local_1c; local_e4 = local_e4 + 1) {
    btAlignedObjectArray<btMultibodyLink>::operator[]
              ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_e4);
    pbVar4 = btAlignedObjectArray<btMultibodyLink>::operator[]
                       ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_e4);
    btAlignedObjectArray<btQuaternion>::operator[](&local_b0,pbVar4->m_parent + 1);
    bVar7 = ::operator*(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    uStack_ec = bVar7.super_btQuadWord.m_floats._8_8_;
    local_208 = bVar7.super_btQuadWord.m_floats[0];
    bStack_204 = bVar7.super_btQuadWord.m_floats[1];
    local_f4 = local_208;
    bStack_f0 = bStack_204;
    in_stack_fffffffffffffde0 =
         btAlignedObjectArray<btQuaternion>::operator[](&local_b0,local_e4 + 1);
    *(ulong *)(in_stack_fffffffffffffde0->super_btQuadWord).m_floats = CONCAT44(bStack_f0,local_f4);
    *(undefined8 *)((in_stack_fffffffffffffde0->super_btQuadWord).m_floats + 2) = uStack_ec;
    in_stack_fffffffffffffdd8 =
         btAlignedObjectArray<btQuaternion>::operator[](&local_b0,local_e4 + 1);
    btQuaternion::inverse(in_stack_fffffffffffffd58._8_8_);
    btAlignedObjectArray<btMultibodyLink>::operator[]
              ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_e4);
    btAlignedObjectArray<btVector3>::operator[](&local_40,local_e4 + 1);
    bVar8 = ::operator*(in_stack_fffffffffffffd68._8_8_,in_stack_fffffffffffffd68._0_8_);
    auVar1._8_4_ = extraout_XMM0_Dc;
    auVar1._0_8_ = bVar8.m_floats._0_8_;
    auVar1._12_4_ = extraout_XMM0_Dd;
    uVar5 = extraout_XMM0_Dc;
    uVar6 = extraout_XMM0_Dd;
    bVar8 = quatRotate(auVar1._8_8_,bVar8.m_floats._0_8_);
    local_104.m_floats._8_8_ = bVar8.m_floats._8_8_;
    in_stack_fffffffffffffd58._8_4_ = uVar5;
    in_stack_fffffffffffffd58._0_4_ = local_104.m_floats[2];
    in_stack_fffffffffffffd58._4_4_ = local_104.m_floats[3];
    in_stack_fffffffffffffd58._12_4_ = uVar6;
    in_stack_fffffffffffffd68._8_4_ = extraout_XMM0_Dc_00;
    in_stack_fffffffffffffd68._0_8_ = bVar8.m_floats._0_8_;
    in_stack_fffffffffffffd68._12_4_ = extraout_XMM0_Dd_00;
    local_104.m_floats[0] = bVar8.m_floats[0];
    local_104.m_floats[1] = bVar8.m_floats[1];
    btVector3::operator+=(&local_10,&local_104);
  }
  btAlignedObjectArray<btQuaternion>::~btAlignedObjectArray
            ((btAlignedObjectArray<btQuaternion> *)0x23a50b);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)0x23a518);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)0x23a525);
  bVar8.m_floats[0] = local_10.m_floats[0];
  auVar10._4_4_ = local_10.m_floats[1];
  register0x00001240 = local_10.m_floats[2];
  register0x00001244 = local_10.m_floats[3];
  return (btVector3)bVar8.m_floats;
}

Assistant:

btVector3 btMultiBody::getAngularMomentum() const
{
	int num_links = getNumLinks();
    // TODO: would be better not to allocate memory here
    btAlignedObjectArray<btVector3> omega;omega.resize(num_links+1);
	btAlignedObjectArray<btVector3> vel;vel.resize(num_links+1);
    btAlignedObjectArray<btQuaternion> rot_from_world;rot_from_world.resize(num_links+1);
    compTreeLinkVelocities(&omega[0], &vel[0]);

    rot_from_world[0] = m_baseQuat;
    btVector3 result = quatRotate(rot_from_world[0].inverse() , (m_baseInertia * omega[0]));

    for (int i = 0; i < num_links; ++i) {
        rot_from_world[i+1] = m_links[i].m_cachedRotParentToThis * rot_from_world[m_links[i].m_parent+1];
        result += (quatRotate(rot_from_world[i+1].inverse() , (m_links[i].m_inertiaLocal * omega[i+1])));
    }

    return result;
}